

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::benchmarkFailed(ConsoleReporter *this,string *error)

{
  ostringstream *poVar1;
  TablePrinter *pTVar2;
  Colour colour;
  char local_1a [2];
  
  Colour::use(Red);
  pTVar2 = (this->m_tablePrinter)._M_t.
           super___uniq_ptr_impl<Catch::TablePrinter,_std::default_delete<Catch::TablePrinter>_>.
           _M_t.
           super__Tuple_impl<0UL,_Catch::TablePrinter_*,_std::default_delete<Catch::TablePrinter>_>.
           super__Head_base<0UL,_Catch::TablePrinter_*,_false>._M_head_impl;
  poVar1 = &pTVar2->m_oss;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Benchmark failed (",0x12);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,(error->_M_dataplus)._M_p,error->_M_string_length);
  local_1a[0] = ')';
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,local_1a,1);
  operator<<();
  if (0 < pTVar2->m_currentColumn) {
    local_1a[1] = 10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pTVar2->m_os,local_1a + 1,1);
    pTVar2->m_currentColumn = -1;
  }
  Colour::use(None);
  return;
}

Assistant:

void ConsoleReporter::benchmarkFailed(std::string const& error) {
	Colour colour(Colour::Red);
    (*m_tablePrinter)
        << "Benchmark failed (" << error << ')'
        << ColumnBreak() << RowBreak();
}